

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::ContinuousAssignSymbol::fromSyntax
               (Compilation *compilation,ContinuousAssignSyntax *syntax,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  group_type_pointer pgVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  size_t __n;
  value_type_pointer pbVar18;
  undefined8 uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  int iVar36;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar37;
  ContinuousAssignSymbol *pCVar38;
  uint uVar39;
  long lVar40;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> args;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  ASTContext context;
  long local_240;
  string_view local_238;
  ContinuousAssignSyntax *local_228;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_220;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_218;
  ulong local_210;
  uint64_t local_208;
  ulong local_200;
  Compilation *local_1f8;
  NetType *local_1f0;
  ContinuousAssignSymbol *local_1e8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  IdentifierNameSyntax *local_1c0;
  SymbolKind *local_1b8;
  ulong local_1b0;
  value_type_pointer local_1a8;
  long local_1a0;
  char *local_198;
  undefined1 local_190 [64];
  locator local_150;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  undefined1 local_128 [136];
  allocator_type local_a0;
  undefined1 local_98 [24];
  value_type_pointer pbStack_80;
  ulong local_78;
  ulong local_70;
  ASTContext local_68;
  
  local_1f8 = compilation;
  local_1e0 = implicitNets;
  ASTContext::resetFlags(&local_68,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  local_1f0 = Scope::getDefaultNetType(local_68.scope.ptr);
  local_128._128_8_ = local_128;
  local_98._0_8_ = 0x3f;
  local_98._8_8_ = 1;
  stack0xffffffffffffff78 = ZEXT816(0x47fac0);
  local_78 = 0;
  local_70 = 0;
  local_200 = (syntax->assignments).elements._M_extent._M_extent_value + 1;
  local_a0.storage = (Storage *)local_128._128_8_;
  if (1 < local_200) {
    local_200 = local_200 >> 1;
    uVar43 = 0;
    local_228 = syntax;
    local_220 = results;
    do {
      ppSVar37 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->assignments).elements._M_ptr + uVar43 * 2));
      args = *ppSVar37;
      if ((local_1f0->netKind != Unknown) && (args->kind == AssignmentExpression)) {
        local_190._0_8_ = local_190 + 0x18;
        local_190._8_8_ = 0;
        local_190._16_8_ = 5;
        Expression::findPotentiallyImplicitNets
                  (*(SyntaxNode **)(args + 1),&local_68,
                   (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_190);
        if (local_190._8_8_ != 0) {
          local_1b8 = &((Symbol *)local_190._0_8_)->kind + local_190._8_8_ * 2;
          pCVar38 = (ContinuousAssignSymbol *)local_190._0_8_;
          local_218 = args;
          local_210 = uVar43;
          do {
            local_1c0 = *(IdentifierNameSyntax **)&pCVar38->super_Symbol;
            local_238 = parsing::Token::valueText(&local_1c0->identifier);
            local_1e8 = pCVar38;
            local_208 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&local_a0,&local_238);
            uVar41 = local_208 >> (local_98[0] & 0x3f);
            uVar19 = local_98._16_8_;
            lVar40 = (local_208 & 0xff) * 4;
            uVar46 = (&UNK_0047fb5c)[lVar40];
            uVar47 = (&UNK_0047fb5d)[lVar40];
            uVar48 = (&UNK_0047fb5e)[lVar40];
            uVar49 = (&UNK_0047fb5f)[lVar40];
            local_1a8 = pbStack_80;
            __n = local_238._M_len;
            local_198 = local_238._M_str;
            uVar43 = (ulong)((uint)local_208 & 7);
            local_1d0 = local_98._8_8_;
            uVar42 = 0;
            uVar50 = uVar46;
            uVar51 = uVar47;
            uVar52 = uVar48;
            uVar53 = uVar49;
            uVar54 = uVar46;
            uVar55 = uVar47;
            uVar56 = uVar48;
            uVar57 = uVar49;
            uVar58 = uVar46;
            uVar59 = uVar47;
            uVar60 = uVar48;
            uVar61 = uVar49;
            local_1b0 = uVar41;
            do {
              pbVar18 = local_1a8;
              local_1a0 = uVar41 * 0x10;
              pgVar1 = (group_type_pointer)(uVar19 + uVar41 * 0x10);
              auVar45[0] = -(pgVar1->m[0].n == uVar46);
              auVar45[1] = -(pgVar1->m[1].n == uVar47);
              auVar45[2] = -(pgVar1->m[2].n == uVar48);
              auVar45[3] = -(pgVar1->m[3].n == uVar49);
              auVar45[4] = -(pgVar1->m[4].n == uVar50);
              auVar45[5] = -(pgVar1->m[5].n == uVar51);
              auVar45[6] = -(pgVar1->m[6].n == uVar52);
              auVar45[7] = -(pgVar1->m[7].n == uVar53);
              auVar45[8] = -(pgVar1->m[8].n == uVar54);
              auVar45[9] = -(pgVar1->m[9].n == uVar55);
              auVar45[10] = -(pgVar1->m[10].n == uVar56);
              auVar45[0xb] = -(pgVar1->m[0xb].n == uVar57);
              auVar45[0xc] = -(pgVar1->m[0xc].n == uVar58);
              auVar45[0xd] = -(pgVar1->m[0xd].n == uVar59);
              auVar45[0xe] = -(pgVar1->m[0xe].n == uVar60);
              auVar45[0xf] = -(pgVar1->m[0xf].n == uVar61);
              local_1c8 = uVar41;
              uVar20 = uVar46;
              uVar21 = uVar47;
              uVar22 = uVar48;
              uVar23 = uVar49;
              uVar24 = uVar50;
              uVar25 = uVar51;
              uVar26 = uVar52;
              uVar27 = uVar53;
              uVar28 = uVar54;
              uVar29 = uVar55;
              uVar30 = uVar56;
              uVar31 = uVar57;
              uVar32 = uVar58;
              uVar33 = uVar59;
              uVar34 = uVar60;
              uVar35 = uVar61;
              uVar2 = local_138;
              uVar3 = uStack_137;
              uVar4 = uStack_136;
              uVar5 = uStack_135;
              uVar6 = uStack_134;
              uVar7 = uStack_133;
              uVar8 = uStack_132;
              uVar9 = uStack_131;
              uVar10 = uStack_130;
              uVar11 = uStack_12f;
              uVar12 = uStack_12e;
              uVar13 = uStack_12d;
              uVar14 = uStack_12c;
              uVar15 = uStack_12b;
              uVar16 = uStack_12a;
              uVar17 = uStack_129;
              for (uVar39 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                  uStack_129 = uVar35, uStack_12a = uVar34, uStack_12b = uVar33, uStack_12c = uVar32
                  , uStack_12d = uVar31, uStack_12e = uVar30, uStack_12f = uVar29,
                  uStack_130 = uVar28, uStack_131 = uVar27, uStack_132 = uVar26, uStack_133 = uVar25
                  , uStack_134 = uVar24, uStack_135 = uVar23, uStack_136 = uVar22,
                  uStack_137 = uVar21, local_138 = uVar20, uVar39 != 0; uVar39 = uVar39 - 1 & uVar39
                  ) {
                iVar36 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> iVar36 & 1) == 0; iVar36 = iVar36 + 1) {
                  }
                }
                bVar44 = __n == *(size_t *)
                                 ((long)&pbVar18[uVar41 * 0xf]._M_len + (ulong)(uint)(iVar36 << 4));
                local_240 = (long)&pbVar18[uVar41 * 0xf]._M_len + (ulong)(uint)(iVar36 << 4);
                local_1d8 = uVar43;
                if (bVar44 && __n != 0) {
                  iVar36 = bcmp(local_198,*(void **)(local_240 + 8),__n);
                  bVar44 = iVar36 == 0;
                  uVar46 = local_138;
                  uVar47 = uStack_137;
                  uVar48 = uStack_136;
                  uVar49 = uStack_135;
                  uVar50 = uStack_134;
                  uVar51 = uStack_133;
                  uVar52 = uStack_132;
                  uVar53 = uStack_131;
                  uVar54 = uStack_130;
                  uVar55 = uStack_12f;
                  uVar56 = uStack_12e;
                  uVar57 = uStack_12d;
                  uVar58 = uStack_12c;
                  uVar59 = uStack_12b;
                  uVar60 = uStack_12a;
                  uVar61 = uStack_129;
                }
                args = local_218;
                syntax = local_228;
                results = local_220;
                if (bVar44) goto LAB_00205005;
                uVar43 = local_1d8;
                uVar20 = local_138;
                uVar21 = uStack_137;
                uVar22 = uStack_136;
                uVar23 = uStack_135;
                uVar24 = uStack_134;
                uVar25 = uStack_133;
                uVar26 = uStack_132;
                uVar27 = uStack_131;
                uVar28 = uStack_130;
                uVar29 = uStack_12f;
                uVar30 = uStack_12e;
                uVar31 = uStack_12d;
                uVar32 = uStack_12c;
                uVar33 = uStack_12b;
                uVar34 = uStack_12a;
                uVar35 = uStack_129;
                uVar2 = local_138;
                uVar3 = uStack_137;
                uVar4 = uStack_136;
                uVar5 = uStack_135;
                uVar6 = uStack_134;
                uVar7 = uStack_133;
                uVar8 = uStack_132;
                uVar9 = uStack_131;
                uVar10 = uStack_130;
                uVar11 = uStack_12f;
                uVar12 = uStack_12e;
                uVar13 = uStack_12d;
                uVar14 = uStack_12c;
                uVar15 = uStack_12b;
                uVar16 = uStack_12a;
                uVar17 = uStack_129;
              }
              local_138 = uVar2;
              uStack_137 = uVar3;
              uStack_136 = uVar4;
              uStack_135 = uVar5;
              uStack_134 = uVar6;
              uStack_133 = uVar7;
              uStack_132 = uVar8;
              uStack_131 = uVar9;
              uStack_130 = uVar10;
              uStack_12f = uVar11;
              uStack_12e = uVar12;
              uStack_12d = uVar13;
              uStack_12c = uVar14;
              uStack_12b = uVar15;
              uStack_12a = uVar16;
              uStack_129 = uVar17;
              if ((((slot_type *)uVar19)[local_1a0 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar43]) == 0) break;
              lVar40 = local_1c8 + uVar42;
              uVar42 = uVar42 + 1;
              uVar41 = lVar40 + 1U & local_1d0;
            } while (uVar42 <= local_1d0);
            local_240 = 0;
LAB_00205005:
            pCVar38 = local_1e8;
            uVar43 = local_210;
            if (local_240 == 0) {
              if (local_70 < local_78) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_150,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_a0,(arrays_type *)local_98,local_1b0,local_208,&local_238);
                local_70 = local_70 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_150,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_a0,local_208,&local_238);
              }
              local_150.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                             NetSymbol::createImplicit(local_1f8,local_1c0,local_1f0);
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1e0,
                         (Symbol **)&local_150);
            }
            pCVar38 = (ContinuousAssignSymbol *)&(pCVar38->super_Symbol).name;
          } while (pCVar38 != (ContinuousAssignSymbol *)local_1b8);
        }
        if ((ContinuousAssignSymbol *)local_190._0_8_ !=
            (ContinuousAssignSymbol *)(local_190 + 0x18)) {
          operator_delete((void *)local_190._0_8_);
        }
      }
      pCVar38 = BumpAllocator::
                emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
                          (&local_1f8->super_BumpAllocator,(ExpressionSyntax *)args);
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&pCVar38->super_Symbol,local_68.scope.ptr,syntax_00);
      local_190._0_8_ = pCVar38;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)local_190);
      uVar43 = uVar43 + 1;
    } while (uVar43 != local_200);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_(local_a0,(table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)local_98);
  return;
}

Assistant:

void ContinuousAssignSymbol::fromSyntax(Compilation& compilation,
                                        const ContinuousAssignSyntax& syntax,
                                        const ASTContext& parentContext,
                                        SmallVectorBase<const Symbol*>& results,
                                        SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();
    SmallSet<std::string_view, 8> seenNames;

    for (auto expr : syntax.assignments) {
        // If not explicitly disabled, check for net references on the lhs of each
        // assignment that should create implicit nets.
        if (!netType.isError()) {
            // The expression here should always be an assignment expression unless
            // the program is already ill-formed (diagnosed by the parser).
            if (expr->kind == SyntaxKind::AssignmentExpression) {
                SmallVector<const IdentifierNameSyntax*> implicitNetNames;
                Expression::findPotentiallyImplicitNets(*expr->as<BinaryExpressionSyntax>().left,
                                                        context, implicitNetNames);

                for (auto ins : implicitNetNames) {
                    if (seenNames.emplace(ins->identifier.valueText()).second) {
                        implicitNets.push_back(
                            &NetSymbol::createImplicit(compilation, *ins, netType));
                    }
                }
            }
        }

        auto symbol = compilation.emplace<ContinuousAssignSymbol>(*expr);
        symbol->setAttributes(*context.scope, syntax.attributes);
        results.push_back(symbol);
    }
}